

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event.cc
# Opt level: O0

void __thiscall
helix::event::event(event *this,event_mask mask,string *symbol,uint64_t timestamp,order_book *ob,
                   trade *t)

{
  undefined8 in_RCX;
  string *in_RDX;
  undefined4 in_ESI;
  undefined4 *in_RDI;
  undefined8 in_R8;
  undefined8 in_R9;
  
  *in_RDI = in_ESI;
  std::__cxx11::string::string((string *)(in_RDI + 2),in_RDX);
  *(undefined8 *)(in_RDI + 10) = in_RCX;
  *(undefined8 *)(in_RDI + 0xc) = in_R8;
  *(undefined8 *)(in_RDI + 0xe) = in_R9;
  return;
}

Assistant:

event::event(event_mask mask, const std::string& symbol, uint64_t timestamp, order_book* ob, trade* t)
    : _mask{mask}
    , _symbol{symbol}
    , _timestamp{timestamp}
    , _ob{ob}
    , _trade{t}
{
}